

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall
sptk::reaper::FdFilter::ComplexDotProduct
          (FdFilter *this,int n,float *r1,float *i1,float *r2,float *i2,float *r3,float *i3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float ti1;
  float tr1;
  float *i2_local;
  float *r2_local;
  float *i1_local;
  float *r1_local;
  int n_local;
  FdFilter *this_local;
  
  i2_local = i2;
  r2_local = r2;
  i1_local = i1;
  r1_local = r1;
  n_local = n;
  if (i2 == (float *)0x0) {
    while (n_local != 0) {
      fVar1 = *r1_local;
      fVar2 = *r2_local;
      *i3 = *r2_local * *i1_local;
      *r3 = fVar1 * fVar2;
      r3 = r3 + 1;
      i3 = i3 + 1;
      r2_local = r2_local + 1;
      i1_local = i1_local + 1;
      r1_local = r1_local + 1;
      n_local = n_local + -1;
    }
  }
  else {
    while (n_local != 0) {
      fVar1 = *r1_local;
      fVar2 = *r2_local;
      fVar3 = *i1_local;
      fVar4 = *i2_local;
      *i3 = *r1_local * *i2_local + *r2_local * *i1_local;
      *r3 = fVar1 * fVar2 + -(fVar3 * fVar4);
      r3 = r3 + 1;
      i3 = i3 + 1;
      i2_local = i2_local + 1;
      r2_local = r2_local + 1;
      i1_local = i1_local + 1;
      r1_local = r1_local + 1;
      n_local = n_local + -1;
    }
  }
  return;
}

Assistant:

void FdFilter::ComplexDotProduct(int n, float *r1, float *i1, float *r2,
                                 float *i2, float *r3, float *i3) {
  float tr1, ti1;

  /* This full complex multiply is only necessary for non-symmetric kernels */
  if (i2) {  // Only supply the i2 vector if you need to do a full
            // complex multiply.
    while (n--) {
      tr1 = (*r1 * *r2) - (*i1 * *i2);
      ti1 = (*r1++ * *i2++) + (*r2++ * *i1++);
      *i3++ = ti1;
      *r3++ = tr1;
    }
  } else {
    /* Can do this iff the filter is symmetric, zero phase.  */
    while (n--) {
      tr1 = (*r1++ * *r2);
      ti1 = (*r2++ * *i1++);
      *i3++ = ti1;
      *r3++ = tr1;
    }
  }
}